

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall
Lowerer::GenerateFastLdElemI(Lowerer *this,Instr **ldElem,bool *instrIsInHelperBlockRef)

{
  ushort uVar1;
  uint uVar2;
  IndirOpnd *indirOpnd;
  Instr *insertBeforeInstr;
  Func *pFVar3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  IRType IVar7;
  bool bVar8;
  ValueType valueType;
  uint32 uVar9;
  BailOutKind BVar10;
  uint uVar11;
  uint uVar12;
  undefined4 *puVar13;
  undefined7 extraout_var;
  LabelInstr *target;
  Instr *pIVar14;
  HelperCallOpnd *this_00;
  IndirOpnd *opnd;
  BailOutInfo *pBVar15;
  IndirOpnd *pIVar16;
  RegOpnd *pRVar17;
  RegOpnd *pRVar18;
  Opnd *pOVar19;
  ProfiledInstr *pPVar20;
  Opnd *pOVar21;
  IntConstOpnd *pIVar22;
  BranchInstr *instr;
  JITTimeFunctionBody *pJVar23;
  FunctionJITTimeInfo *pFVar24;
  char16 *pcVar25;
  char16 *pcVar26;
  char16 *pcVar27;
  ushort uVar28;
  LowererMD *pLVar29;
  FldInfoFlags flags;
  Lowerer *this_01;
  char16_t *pcVar30;
  undefined4 uVar31;
  JnHelperMethod fnHelper;
  byte bVar32;
  wchar local_228 [4];
  char16 debugStringBuffer_1 [42];
  undefined1 local_1c8 [8];
  char16 debugStringBuffer [42];
  undefined1 local_c0 [8];
  AutoReuseOpnd autoReuseIndirOpnd;
  undefined1 local_a0 [8];
  AutoReuseOpnd autoReuseReg;
  RegOpnd *local_80;
  Opnd *maskOpnd;
  Opnd *local_70;
  LowererMD *local_68;
  LowererMD *local_60;
  LowererMD *local_58;
  bool local_4c;
  bool local_4b;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4a;
  uint local_48;
  bool isTypedArrayElement;
  bool isStringIndex;
  ValueType baseValueType;
  bool indirOpndOverflowed;
  bool local_31 [8];
  bool emitBailout;
  
  if (instrIsInHelperBlockRef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x46fa,"(instrIsInHelperBlockRef)","instrIsInHelperBlockRef");
    if (!bVar5) goto LAB_005b0406;
    *puVar13 = 0;
  }
  *instrIsInHelperBlockRef = false;
  indirOpnd = (IndirOpnd *)(*ldElem)->m_src1;
  autoReuseIndirOpnd._16_8_ = instrIsInHelperBlockRef;
  OVar6 = IR::Opnd::GetKind((Opnd *)indirOpnd);
  if (OVar6 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4704,"(src1->IsIndirOpnd())","Expected indirOpnd on LdElementI");
    if (!bVar5) goto LAB_005b0406;
    *puVar13 = 0;
  }
  OVar6 = IR::Opnd::GetKind((Opnd *)indirOpnd);
  if (OVar6 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar5) goto LAB_005b0406;
    *puVar13 = 0;
  }
  pIVar14 = *ldElem;
  if (pIVar14->m_opcode == LdMethodElem) {
    local_1c8._0_2_ = (indirOpnd->m_baseOpnd->super_Opnd).m_valueType.field_0.bits;
    bVar5 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)local_1c8);
    bVar32 = 1;
    if (bVar5) goto LAB_005af29c;
    pIVar14 = *ldElem;
  }
  uVar31 = 0;
  local_58 = (LowererMD *)IR::Instr::GetOrCreateContinueLabel(pIVar14,false);
  local_60 = (LowererMD *)IR::LabelInstr::New(Label,this->m_func,true);
  bVar5 = IR::Instr::DoStackArgsOpt(*ldElem);
  if (!bVar5) {
    local_1c8._0_2_ = (indirOpnd->m_baseOpnd->super_Opnd).m_valueType.field_0.bits;
    bVar5 = ValueType::IsLikelyNativeArray((ValueType *)local_1c8);
    uVar31 = (undefined4)CONCAT71(extraout_var,bVar5);
  }
  local_31[0] = false;
  bVar5 = IR::Instr::DoStackArgsOpt(*ldElem);
  maskOpnd._4_4_ = uVar31;
  if (bVar5) {
    GenerateFastArgumentsLdElemI(this,*ldElem,(LabelInstr *)local_58);
    local_31[0] = true;
LAB_005aed12:
    target = (LabelInstr *)0x0;
    pLVar29 = (LowererMD *)0x0;
LAB_005aed18:
    IR::Instr::InsertBefore(*ldElem,(Instr *)local_60);
    *(undefined1 *)autoReuseIndirOpnd._16_8_ = 1;
    if (maskOpnd._4_1_ != '\0') {
      local_68 = pLVar29;
      if (((*ldElem)->field_0x38 & 0x10) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x48cc,"(ldElem->HasBailOutInfo())","ldElem->HasBailOutInfo()");
        if (!bVar5) goto LAB_005b0406;
        *puVar13 = 0;
      }
      if (local_60 == local_68) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x48cd,"(labelHelper != labelBailOut)","labelHelper != labelBailOut");
        if (!bVar5) goto LAB_005b0406;
        *puVar13 = 0;
      }
      pLVar29 = local_68;
      LowerOneBailOutKind(this,*ldElem,BailOutConventionalNativeArrayAccessOnly,false,false);
      pIVar14 = *ldElem;
      insertBeforeInstr = pIVar14->m_next;
      if (pIVar14->m_kind != InstrKindProfiled) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
        if (!bVar5) goto LAB_005b0406;
        *puVar13 = 0;
        pLVar29 = local_68;
      }
      local_1c8._0_2_ = *(undefined2 *)((long)pIVar14[1]._vptr_Instr + 2);
      bVar5 = ValueType::HasBeenUndefined((ValueType *)local_1c8);
      if (bVar5) {
        if (local_31[0] == false) {
          if (target == (LabelInstr *)0x0) {
            target = IR::LabelInstr::New(Label,this->m_func,true);
            (target->super_Instr).m_noLazyHelperAssert = true;
          }
          InsertMissingItemCompareBranch(this,(*ldElem)->m_dst,BrEq_A,target,insertBeforeInstr);
          InsertBranch(Br,false,(LabelInstr *)local_58,insertBeforeInstr);
        }
        else {
          InsertBranch(Br,false,(LabelInstr *)local_58,insertBeforeInstr);
          if (target == (LabelInstr *)0x0) goto LAB_005af25b;
        }
        IR::Instr::InsertBefore(insertBeforeInstr,&target->super_Instr);
        pOVar21 = (*ldElem)->m_src1;
        autoReuseReg._16_8_ = ldElem;
        OVar6 = IR::Opnd::GetKind(pOVar21);
        if (OVar6 != OpndKindIndir) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar13 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
          if (!bVar5) goto LAB_005b0406;
          *puVar13 = 0;
        }
        local_1c8._0_2_ = *(undefined2 *)(pOVar21[1]._vptr_Opnd + 1);
        bVar5 = ValueType::HasIntElements((ValueType *)local_1c8);
        fnHelper = HelperIntArr_ToVarArray;
        if (!bVar5) {
          local_1c8._0_2_ = *(undefined2 *)(pOVar21[1]._vptr_Opnd + 1);
          bVar5 = ValueType::HasFloatElements((ValueType *)local_1c8);
          fnHelper = HelperFloatArr_ToVarArray;
          if (!bVar5) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar13 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x4905,
                               "(indirOpnd->GetBaseOpnd()->GetValueType().HasFloatElements())",
                               "indirOpnd->GetBaseOpnd()->GetValueType().HasFloatElements()");
            if (!bVar5) goto LAB_005b0406;
            *puVar13 = 0;
          }
        }
        local_60 = &this->m_lowererMD;
        LowererMD::LoadHelperArgument(local_60,insertBeforeInstr,(Opnd *)pOVar21[1]._vptr_Opnd);
        pIVar14 = IR::Instr::New(Call,this->m_func);
        this_00 = IR::HelperCallOpnd::New(fnHelper,this->m_func);
        if (pIVar14->m_src1 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar13 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
          if (!bVar5) goto LAB_005b0406;
          *puVar13 = 0;
        }
        pFVar3 = pIVar14->m_func;
        if ((this_00->super_Opnd).isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar13 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar5) {
LAB_005b0406:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar13 = 0;
        }
        bVar32 = (this_00->super_Opnd).field_0xb;
        if ((bVar32 & 2) != 0) {
          this_00 = (HelperCallOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar3);
          bVar32 = (this_00->super_Opnd).field_0xb;
        }
        (this_00->super_Opnd).field_0xb = bVar32 | 2;
        pIVar14->m_src1 = &this_00->super_Opnd;
        IR::Instr::InsertBefore(insertBeforeInstr,pIVar14);
        LowererMD::LowerCall(local_60,pIVar14,0);
        ldElem = (Instr **)autoReuseReg._16_8_;
        pLVar29 = local_68;
      }
      else {
        if (local_31[0] == false) {
          InsertMissingItemCompareBranch
                    (this,(*ldElem)->m_dst,BrEq_A,(LabelInstr *)pLVar29,insertBeforeInstr);
        }
        InsertBranch(Br,false,(LabelInstr *)local_58,insertBeforeInstr);
      }
LAB_005af25b:
      IR::Instr::InsertBefore(insertBeforeInstr,(Instr *)pLVar29);
    }
    bVar32 = 1;
    if (local_31[0] != true) goto LAB_005af29c;
    IR::Instr::UnlinkSrc1(*ldElem);
    IR::Instr::UnlinkDst(*ldElem);
    GenerateBailOut(this,*ldElem,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    bVar32 = local_31[0];
  }
  else {
    bVar5 = GenerateFastStringLdElem(this,*ldElem,(LabelInstr *)local_60,(LabelInstr *)local_58);
    if (bVar5) goto LAB_005aed12;
    if ((char)uVar31 == '\0') {
      local_68 = (LowererMD *)0x0;
      pLVar29 = local_60;
    }
    else {
      bVar32 = 1;
      if ((*ldElem)->m_dst->m_type == TyVar) goto LAB_005af29c;
      if ((*ldElem)->m_kind != InstrKindProfiled) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x4742,"(ldElem->IsProfiledInstr())","ldElem->IsProfiledInstr()");
        if (!bVar5) goto LAB_005b0406;
        *puVar13 = 0;
      }
      local_68 = (LowererMD *)IR::LabelInstr::New(Label,this->m_func,true);
      pLVar29 = local_68;
    }
    pIVar14 = *ldElem;
    if (pIVar14->m_kind == InstrKindProfiled) {
      flags = *(FldInfoFlags *)((long)pIVar14[1]._vptr_Instr + 4);
    }
    else {
      flags = FldInfo_NoInfo;
    }
    baseValueType.field_0.bits._1_1_ = 0;
    local_80 = (RegOpnd *)0x0;
    autoReuseReg._16_8_ = ldElem;
    OVar6 = IR::Opnd::GetKind((Opnd *)indirOpnd);
    if (OVar6 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar5) goto LAB_005b0406;
      *puVar13 = 0;
    }
    opnd = GenerateFastElemICommon
                     (this,pIVar14,false,indirOpnd,(LabelInstr *)local_60,(LabelInstr *)pLVar29,
                      (LabelInstr *)local_58,&local_4c,&local_4b,local_31,(Opnd **)&local_80,
                      (LabelInstr **)0x0,true,false,false,(LabelInstr *)0x0,
                      (bool *)((long)&baseValueType.field_0.bits + 1),flags);
    ldElem = (Instr **)autoReuseReg._16_8_;
    pOVar21 = *(Opnd **)(*(long *)autoReuseReg._16_8_ + 0x40);
    OVar6 = IR::Opnd::GetKind(pOVar21);
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) goto LAB_005b0406;
      *puVar13 = 0;
    }
    if (opnd != (IndirOpnd *)0x0) {
      local_48 = (uint)pOVar21->m_type;
      local_c0 = (undefined1  [8])0x0;
      IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_c0,&opnd->super_Opnd,this->m_func,true);
      OVar6 = IR::Opnd::GetKind((Opnd *)indirOpnd);
      if (OVar6 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar5) goto LAB_005b0406;
        *puVar13 = 0;
      }
      local_4a = (indirOpnd->m_baseOpnd->super_Opnd).m_valueType.field_0;
      if ((((*ldElem)->field_0x38 & 0x10) == 0) ||
         (uVar9 = IR::Instr::GetByteCodeOffset(*ldElem), uVar9 == 0xffffffff)) {
LAB_005af4d9:
        OVar6 = IR::Opnd::GetKind((Opnd *)indirOpnd);
        if (OVar6 != OpndKindIndir) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar13 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
          if (!bVar5) goto LAB_005b0406;
          *puVar13 = 0;
        }
        if (indirOpnd->m_indexOpnd != (RegOpnd *)0x0) {
          OVar6 = IR::Opnd::GetKind((Opnd *)indirOpnd);
          if (OVar6 != OpndKindIndir) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar13 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
            if (!bVar5) goto LAB_005b0406;
            *puVar13 = 0;
          }
          bVar5 = IR::Opnd::IsEqual(pOVar21,&indirOpnd->m_indexOpnd->super_Opnd);
          if (bVar5) goto LAB_005af5b8;
        }
      }
      else {
        pBVar15 = IR::Instr::GetBailOutInfo(*ldElem);
        uVar2 = pBVar15->bailOutOffset;
        uVar9 = IR::Instr::GetByteCodeOffset(*ldElem);
        if (uVar9 < uVar2) goto LAB_005af4d9;
        pIVar16 = IR::Opnd::AsIndirOpnd((Opnd *)indirOpnd);
        bVar5 = IR::Opnd::IsEqual(pOVar21,&pIVar16->m_baseOpnd->super_Opnd);
        if (!bVar5) goto LAB_005af4d9;
LAB_005af5b8:
        pIVar14 = IR::Instr::SinkDst(*ldElem,Ld_A,RegNOREG,(Instr *)0x0);
        IR::Instr::Unlink(pIVar14);
        IR::Instr::InsertAfter((Instr *)local_58,pIVar14);
        LowererMD::ChangeToAssign(pIVar14);
        pOVar21 = *(Opnd **)((long)*ldElem + 0x40);
      }
      if (local_4c == true) {
        local_a0 = (undefined1  [8])0x0;
        autoReuseReg.func._1_1_ = 1;
        local_70 = pOVar21;
        OVar6 = IR::Opnd::GetKind(pOVar21);
        if (OVar6 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar13 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x47df,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
          if (!bVar5) goto LAB_005b0406;
          *puVar13 = 0;
        }
        IVar7 = (opnd->super_Opnd).m_type;
        if ((byte)(IVar7 - TyFloat32) < 2) {
          if ((local_48 != 10) && (local_48 != 0x17)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar13 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x47e3,"((dstType == TyFloat64) || (dstType == TyVar))",
                               "For Float32Array LdElemI\'s dst should be specialized to TyFloat64 or not at all."
                              );
            if (!bVar5) goto LAB_005b0406;
            *puVar13 = 0;
            IVar7 = (opnd->super_Opnd).m_type;
          }
          if (IVar7 == TyFloat64) {
LAB_005aff0d:
            if (local_48 == 10) {
              pRVar18 = IR::Opnd::AsRegOpnd(local_70);
            }
            else {
              pRVar18 = IR::RegOpnd::New(TyFloat64,this->m_func);
            }
            IR::AutoReuseOpnd::Initialize
                      ((AutoReuseOpnd *)local_a0,&pRVar18->super_Opnd,this->m_func,true);
            InsertMove(&pRVar18->super_Opnd,&opnd->super_Opnd,*ldElem,true);
          }
          else {
            if (IVar7 != TyFloat32) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar13 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x47f3,"(indirOpnd->IsFloat64())","indirOpnd->IsFloat64()");
              if (!bVar5) goto LAB_005b0406;
              *puVar13 = 0;
              goto LAB_005aff0d;
            }
            pRVar17 = IR::RegOpnd::New(TyFloat32,this->m_func);
            local_1c8 = (undefined1  [8])0x0;
            IR::AutoReuseOpnd::Initialize
                      ((AutoReuseOpnd *)local_1c8,&pRVar17->super_Opnd,this->m_func,true);
            InsertMove(&pRVar17->super_Opnd,&opnd->super_Opnd,*ldElem,true);
            if (local_48 == 10) {
              pRVar18 = IR::Opnd::AsRegOpnd(local_70);
            }
            else {
              pRVar18 = IR::RegOpnd::New(TyFloat64,this->m_func);
            }
            IR::AutoReuseOpnd::Initialize
                      ((AutoReuseOpnd *)local_a0,&pRVar18->super_Opnd,this->m_func,true);
            InsertConvertFloat32ToFloat64(&pRVar18->super_Opnd,&pRVar17->super_Opnd,*ldElem);
            IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_1c8);
          }
          if (local_48 != 10) {
            pRVar17 = IR::Opnd::AsRegOpnd(local_70);
            LowererMD::SaveDoubleToVar(&this->m_lowererMD,pRVar17,pRVar18,*ldElem,*ldElem,false);
          }
          pIVar14 = IR::Instr::New(UCOMISD,this->m_func);
          if (pIVar14->m_src1 != (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar13 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src."
                              );
            if (!bVar5) goto LAB_005b0406;
            *puVar13 = 0;
          }
          pFVar3 = pIVar14->m_func;
          if ((pRVar18->super_Opnd).isDeleted == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar13 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x14,"(!isDeleted)","Using deleted operand");
            if (!bVar5) goto LAB_005b0406;
            *puVar13 = 0;
          }
          bVar32 = (pRVar18->super_Opnd).field_0xb;
          pRVar17 = pRVar18;
          if ((bVar32 & 2) != 0) {
            pRVar17 = (RegOpnd *)IR::Opnd::Copy(&pRVar18->super_Opnd,pFVar3);
            bVar32 = (pRVar17->super_Opnd).field_0xb;
          }
          (pRVar17->super_Opnd).field_0xb = bVar32 | 2;
          pIVar14->m_src1 = &pRVar17->super_Opnd;
          if (pIVar14->m_src2 != (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar13 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src."
                              );
            if (!bVar5) goto LAB_005b0406;
            *puVar13 = 0;
          }
          pFVar3 = pIVar14->m_func;
          if ((pRVar18->super_Opnd).isDeleted == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar13 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x14,"(!isDeleted)","Using deleted operand");
            if (!bVar5) goto LAB_005b0406;
            *puVar13 = 0;
          }
          bVar32 = (pRVar18->super_Opnd).field_0xb;
          if ((bVar32 & 2) != 0) {
            pRVar18 = (RegOpnd *)IR::Opnd::Copy(&pRVar18->super_Opnd,pFVar3);
            bVar32 = (pRVar18->super_Opnd).field_0xb;
          }
          (pRVar18->super_Opnd).field_0xb = bVar32 | 2;
          pIVar14->m_src2 = &pRVar18->super_Opnd;
          IR::Instr::InsertBefore(*ldElem,pIVar14);
          instr = IR::BranchInstr::New(JP,(LabelInstr *)local_60,this->m_func);
          IR::Instr::InsertBefore(*ldElem,&instr->super_Instr);
          if (local_48 == 10) {
LAB_005b0279:
            local_31[0] = true;
          }
        }
        else {
          if ((local_48 == 3) || (local_48 == 0x17)) {
            if (local_48 != 3) goto LAB_005afd17;
            pRVar18 = IR::Opnd::AsRegOpnd(local_70);
          }
          else {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar13 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x482a,"((dstType == TyInt32) || (dstType == TyVar))",
                               "For Int/UintArray LdElemI\'s dst should be specialized to TyInt32 or not at all."
                              );
            if (!bVar5) goto LAB_005b0406;
            *puVar13 = 0;
LAB_005afd17:
            pRVar18 = IR::RegOpnd::New(TyInt32,this->m_func);
          }
          IR::AutoReuseOpnd::Initialize
                    ((AutoReuseOpnd *)local_a0,&pRVar18->super_Opnd,this->m_func,true);
          if ((opnd->super_Opnd).m_type != TyUint32) {
            valueType = ValueType::GetTaggedInt();
            IR::Opnd::SetValueType(&pRVar18->super_Opnd,valueType);
          }
          pIVar14 = InsertMove(&pRVar18->super_Opnd,&opnd->super_Opnd,*ldElem,true);
          if (local_80 != (RegOpnd *)0x0) {
            IVar7 = (pRVar18->super_Opnd).m_type;
            if (TySize[(local_80->super_Opnd).m_type] != (uint)IVar7) {
              pOVar21 = IR::Opnd::UseWithNewType(&local_80->super_Opnd,IVar7,this->m_func);
              local_80 = IR::Opnd::AsRegOpnd(pOVar21);
            }
            pIVar14 = InsertAnd(&pRVar18->super_Opnd,&pRVar18->super_Opnd,&local_80->super_Opnd,
                                *ldElem);
          }
          if (local_48 == 3) {
            uVar28 = *(ushort *)((long)*ldElem + 0x36) & 2;
            uVar1 = *(ushort *)&pIVar14->field_0x36;
            *(ushort *)&pIVar14->field_0x36 = uVar1 & 0xfffd | uVar28;
            *(ushort *)&pIVar14->field_0x36 =
                 uVar1 & 0xfff9 | uVar28 | *(ushort *)((long)*ldElem + 0x36) & 4;
            if ((opnd->super_Opnd).m_type == TyUint32) {
              this_01 = (Lowerer *)0x0;
              pIVar22 = IR::IntConstOpnd::New(0,TyUint32,this->m_func,true);
              InsertCompareBranch(this_01,&pRVar18->super_Opnd,&pIVar22->super_Opnd,BrLt_A,false,
                                  (LabelInstr *)local_60,*ldElem,false);
            }
            goto LAB_005b0279;
          }
          pIVar14 = IR::Instr::New(ToVar,local_70,&pRVar18->super_Opnd,this->m_func);
          uVar28 = *(ushort *)((long)*ldElem + 0x36) & 2;
          uVar1 = *(ushort *)&pIVar14->field_0x36;
          *(ushort *)&pIVar14->field_0x36 = uVar1 & 0xfffd | uVar28;
          *(ushort *)&pIVar14->field_0x36 =
               uVar1 & 0xfff9 | uVar28 | *(ushort *)((long)*ldElem + 0x36) & 4;
          IR::Instr::InsertBefore(*ldElem,pIVar14);
          LowererMD::EmitLoadVar
                    (&this->m_lowererMD,pIVar14,(opnd->super_Opnd).m_type == TyUint32,false);
        }
        InsertBranch(Br,false,(LabelInstr *)local_58,*ldElem);
        pJVar23 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar23);
        pFVar24 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
        uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar24);
        bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,TypedArrayTypeSpecPhase,uVar11,uVar12)
        ;
        if (bVar5) {
          pJVar23 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
          uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar23);
          pFVar24 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
          uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar24);
          bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,LowererPhase,uVar11,uVar12);
          if (bVar5) {
            ValueType::ToString((ValueType *)&local_4a.field_0,(char (*) [256])local_1c8);
            pJVar23 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
            pcVar25 = JITTimeFunctionBody::GetDisplayName(pJVar23);
            pFVar24 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
            pcVar26 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar24,(wchar (*) [42])local_228);
            pcVar27 = Js::OpCodeUtil::GetOpCodeName(*(OpCode *)((long)*ldElem + 0x30));
            pcVar30 = L"specialized";
            if (local_70->m_type == TyVar) {
              pcVar30 = L"not specialized";
            }
            Output::Print(L"Typed Array Lowering: function: %s (%s), instr: %s, base value type: %S, %s."
                          ,pcVar25,pcVar26,pcVar27,local_1c8,pcVar30);
            Output::Print(L"\n");
            Output::Flush();
          }
        }
        IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_a0);
        target = (LabelInstr *)0x0;
      }
      else {
        InsertMove(pOVar21,&opnd->super_Opnd,*ldElem,true);
        if (local_80 != (RegOpnd *)0x0) {
          if (TySize[(local_80->super_Opnd).m_type] != (uint)pOVar21->m_type) {
            pOVar19 = IR::Opnd::UseWithNewType(&local_80->super_Opnd,pOVar21->m_type,this->m_func);
            local_80 = IR::Opnd::AsRegOpnd(pOVar19);
          }
          InsertAnd(pOVar21,pOVar21,&local_80->super_Opnd,*ldElem);
        }
        if ((char)maskOpnd._4_4_ == '\0' && local_4b == false) {
          bVar5 = *(short *)((long)*ldElem + 0x30) == 0x99;
LAB_005af97c:
          bVar8 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_4a.field_0);
          if ((bVar8) &&
             (bVar8 = ValueType::HasNoMissingValues((ValueType *)&local_4a.field_0), bVar8)) {
            if (bVar5 == false) goto LAB_005afc03;
            target = (LabelInstr *)0x0;
          }
          else {
            pLVar29 = local_58;
            if (bVar5 != false) {
              pLVar29 = local_60;
            }
            InsertMissingItemCompareBranch
                      (this,pOVar21,bVar5 ^ BrNeq_A,(LabelInstr *)pLVar29,*ldElem);
            if (maskOpnd._4_1_ == '\0') {
              target = (LabelInstr *)0x0;
            }
            else {
              if (bVar5 != false) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                *puVar13 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                   ,0x489e,"(!needObjectTest)","!needObjectTest");
                if (!bVar8) goto LAB_005b0406;
                *puVar13 = 0;
              }
              if (local_60 == local_68) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                *puVar13 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                   ,0x489f,"(labelHelper != labelBailOut)",
                                   "labelHelper != labelBailOut");
                if (!bVar8) goto LAB_005b0406;
                *puVar13 = 0;
              }
              pLVar29 = local_68;
              pPVar20 = IR::Instr::AsProfiledInstr(*ldElem);
              local_1c8._0_2_ = (((pPVar20->u).ldElemInfo)->elemType).field_0.bits;
              bVar8 = ValueType::HasBeenUndefined((ValueType *)local_1c8);
              if (bVar8) {
                target = IR::LabelInstr::New(Label,this->m_func,true);
                InsertBranch(Br,false,target,*ldElem);
              }
              else {
                target = (LabelInstr *)0x0;
                InsertBranch(Br,false,(LabelInstr *)pLVar29,*ldElem);
              }
            }
            if (bVar5 == false) goto LAB_005b03ed;
          }
          LowererMD::GenerateObjectTest
                    (&this->m_lowererMD,pOVar21,*ldElem,(LabelInstr *)local_58,true);
        }
        else {
          if (local_4b == false) {
            bVar5 = false;
            goto LAB_005af97c;
          }
LAB_005afc03:
          target = (LabelInstr *)0x0;
          InsertBranch(Br,false,(LabelInstr *)local_58,*ldElem);
        }
      }
LAB_005b03ed:
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_c0);
      pLVar29 = local_68;
      goto LAB_005aed18;
    }
    if (((((*ldElem)->field_0x38 & 0x10) != 0) &&
        (BVar10 = IR::Instr::GetBailOutKind(*ldElem), (BVar10 >> 0x11 & 1) != 0)) &&
       (baseValueType.field_0.bits._1_1_ == '\0')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4769,
                         "(!(ldElem->HasBailOutInfo() && ldElem->GetBailOutKind() & IR::BailOutOnArrayAccessHelperCall) || indirOpndOverflowed)"
                         ,
                         "!(ldElem->HasBailOutInfo() && ldElem->GetBailOutKind() & IR::BailOutOnArrayAccessHelperCall) || indirOpndOverflowed"
                        );
      if (!bVar5) goto LAB_005b0406;
      *puVar13 = 0;
    }
    if ((baseValueType.field_0.bits._1_1_ != '\x01') || (((*ldElem)->field_0x38 & 0x10) == 0)) {
      if (pOVar21->m_type != TyVar) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x47af,"(false)",
                           "Global optimizer shouldn\'t have specialized this instruction.");
        if (bVar5) {
          *puVar13 = 0;
          OVar6 = IR::Opnd::GetKind(pOVar21);
          if (OVar6 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x47b0,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
            if (!bVar5) goto LAB_005b0406;
            *puVar13 = 0;
          }
          bVar32 = 0;
          pIVar22 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,true);
          InsertMove(pOVar21,&pIVar22->super_Opnd,*ldElem,true);
          IR::Instr::FreeSrc1(*ldElem);
          IR::Instr::FreeDst(*ldElem);
          GenerateBailOut(this,*ldElem,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
          goto LAB_005af29c;
        }
        goto LAB_005b0406;
      }
      pJVar23 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar23);
      pFVar24 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
      uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar24);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,TypedArrayTypeSpecPhase,uVar11,uVar12);
      bVar32 = 1;
      if (bVar5) {
        pJVar23 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar23);
        pFVar24 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
        uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar24);
        bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,LowererPhase,uVar11,uVar12);
        if (bVar5) {
          pJVar23 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
          pcVar25 = JITTimeFunctionBody::GetDisplayName(pJVar23);
          pFVar24 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
          pcVar26 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar24,(wchar (*) [42])local_1c8);
          pcVar27 = Js::OpCodeUtil::GetOpCodeName(*(OpCode *)((long)*ldElem + 0x30));
          Output::Print(L"Typed Array Lowering: function: %s (%s): instr %s, not specialized by glob opt due to negative or not likely int index.\n"
                        ,pcVar25,pcVar26,pcVar27);
          Output::Flush();
        }
      }
      goto LAB_005af29c;
    }
    BVar10 = IR::Instr::GetBailOutKind(*ldElem);
    bVar32 = (BVar10 & ~BailOutKindBits) == BailOutConventionalTypedArrayAccessOnly;
    if ((bool)bVar32) {
      IVar7 = pOVar21->m_type;
      if (IVar7 == TyVar) {
        pOVar19 = LoadLibraryValueOpnd(this,*ldElem,ValueUndefined);
        InsertMove(pOVar21,pOVar19,*ldElem,true);
        IR::Instr::FreeSrc1(*ldElem);
        IR::Instr::FreeDst(*ldElem);
        IR::Instr::Remove(*ldElem);
        goto LAB_005afc81;
      }
LAB_005afc93:
      if ((byte)(IVar7 - TyFloat32) < 2) {
        pIVar22 = (IntConstOpnd *)IR::FloatConstOpnd::New(NAN,TyFloat64,this->m_func);
      }
      else {
        pIVar22 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,true);
      }
      InsertMove(pOVar21,&pIVar22->super_Opnd,*ldElem,true);
      IR::Instr::FreeSrc1(*ldElem);
      IR::Instr::FreeDst(*ldElem);
      GenerateBailOut(this,*ldElem,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
      bVar32 = 1;
    }
    else {
LAB_005afc81:
      if ((BVar10 & (BailOutOnArrayAccessHelperCall|BailOutConventionalNativeArrayAccessOnly)) !=
          BailOutInvalid) {
        IVar7 = pOVar21->m_type;
        goto LAB_005afc93;
      }
    }
  }
  bVar32 = bVar32 ^ 1;
LAB_005af29c:
  return (bool)(bVar32 & 1);
}

Assistant:

bool
Lowerer::GenerateFastLdElemI(IR::Instr *& ldElem, bool *instrIsInHelperBlockRef)
{
    Assert(instrIsInHelperBlockRef);
    bool &instrIsInHelperBlock = *instrIsInHelperBlockRef;
    instrIsInHelperBlock = false;

    IR::LabelInstr *    labelHelper;
    IR::LabelInstr *    labelFallThru;
    IR::LabelInstr *    labelBailOut = nullptr;
    IR::LabelInstr *    labelMissingNative = nullptr;
    IR::Opnd *src1 =    ldElem->GetSrc1();

    AssertMsg(src1->IsIndirOpnd(), "Expected indirOpnd on LdElementI");

    IR::IndirOpnd *     indirOpnd = src1->AsIndirOpnd();

    // From FastElemICommon:
    //  TEST base, AtomTag                  -- check base not tagged int
    //  JNE $helper
    //  MOV r1, [base + offset(type)]       -- check base isArray
    //  CMP [r1 + offset(typeId)], TypeIds_Array
    //  JNE $helper
    //  TEST index, 1                       -- index tagged int
    //  JEQ $helper
    //  MOV r2, index
    //  SAR r2, Js::VarTag_Shift            -- remoe atom tag
    //  JS $helper                          -- exclude negative index
    //  MOV r4, [base + offset(head)]
    //  CMP r2, [r4 + offset(length)]       -- bounds check
    //  JAE $helper
    //  MOV r3, [r4 + offset(elements)]

    // Generated here:
    //  MOV dst, [r3 + r2]
    //  TEST dst, dst
    //  JNE $fallthrough

    if(ldElem->m_opcode == Js::OpCode::LdMethodElem && indirOpnd->GetBaseOpnd()->GetValueType().IsLikelyOptimizedTypedArray())
    {
        // Typed arrays don't return objects, so it's not worth generating a fast path for LdMethodElem. Calling the helper also
        // generates a better error message. Skip the fast path and just generate a helper call.
        return true;
    }

    labelFallThru = ldElem->GetOrCreateContinueLabel();
    labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    // If we know for sure (based on flow graph) we're loading from the arguments object, then ignore the (path-based) profile info.
    bool isNativeArrayLoad = !ldElem->DoStackArgsOpt() && indirOpnd->GetBaseOpnd()->GetValueType().IsLikelyNativeArray();
    bool needMissingValueCheck = true;
    bool emittedFastPath = false;
    bool emitBailout = false;

    if (ldElem->DoStackArgsOpt())
    {
        emittedFastPath = GenerateFastArgumentsLdElemI(ldElem, labelFallThru);
        emitBailout = true;
    }
    else if (GenerateFastStringLdElem(ldElem, labelHelper, labelFallThru))
    {
        emittedFastPath = true;
    }
    else
    {
        IR::LabelInstr * labelCantUseArray = labelHelper;
        if (isNativeArrayLoad)
        {
            if (ldElem->GetDst()->GetType() == TyVar)
            {
                // Skip the fast path and just generate a helper call
                return true;
            }

            // Specialized native array lowering for LdElem requires that it is profiled. When not profiled, GlobOpt should not
            // have specialized it.
            Assert(ldElem->IsProfiledInstr());

            labelBailOut = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
            labelCantUseArray = labelBailOut;
        }
        Js::FldInfoFlags flags = Js::FldInfo_NoInfo;
        if (ldElem->IsProfiledInstr())
        {
            flags = ldElem->AsProfiledInstr()->u.ldElemInfo->flags;
        }
        bool isTypedArrayElement, isStringIndex, indirOpndOverflowed = false;
        IR::Opnd* maskOpnd = nullptr;
        indirOpnd =
            GenerateFastElemICommon(
                ldElem,
                false,
                src1->AsIndirOpnd(),
                labelHelper,
                labelCantUseArray,
                labelFallThru,
                &isTypedArrayElement,
                &isStringIndex,
                &emitBailout,
                &maskOpnd,
                nullptr,    /* pLabelSegmentLengthIncreased */
                true,       /* checkArrayLengthOverflow */
                false,      /* forceGenerateFastPath */
                false,      /* returnLength */
                nullptr,    /* bailOutLabelInstr */
                &indirOpndOverflowed,
                flags);

        IR::Opnd *dst = ldElem->GetDst();
        IRType dstType = dst->AsRegOpnd()->GetType();

        // The index is negative or not int.
        if (indirOpnd == nullptr)
        {
            // could have bailout kind BailOutOnArrayAccessHelperCall if indirOpnd overflows
            Assert(!(ldElem->HasBailOutInfo() && ldElem->GetBailOutKind() & IR::BailOutOnArrayAccessHelperCall) || indirOpndOverflowed);

            // don't check fast path without bailout because it might not be TypedArray
            if (indirOpndOverflowed && ldElem->HasBailOutInfo())
            {
                bool bailoutForOpndOverflow = false;
                const IR::BailOutKind bailOutKind = ldElem->GetBailOutKind();

                // return undefined for typed array if load dest is var, bailout otherwise
                if ((bailOutKind & ~IR::BailOutKindBits) == IR::BailOutConventionalTypedArrayAccessOnly)
                {
                    if (dst->IsVar())
                    {
                        // returns undefined in case of indirOpnd overflow which is consistent with behavior of interpreter
                        IR::Opnd * undefinedOpnd = this->LoadLibraryValueOpnd(ldElem, LibraryValue::ValueUndefined);
                        InsertMove(dst, undefinedOpnd, ldElem);

                        ldElem->FreeSrc1();
                        ldElem->FreeDst();
                        ldElem->Remove();

                        emittedFastPath = true;
                    }
                    else
                    {
                        bailoutForOpndOverflow = true;
                    }
                }

                if (bailoutForOpndOverflow || (bailOutKind & (IR::BailOutConventionalNativeArrayAccessOnly | IR::BailOutOnArrayAccessHelperCall)))
                {
                    IR::Opnd * constOpnd = nullptr;
                    if (dst->IsFloat())
                    {
                        constOpnd = IR::FloatConstOpnd::New(Js::JavascriptNumber::NaN, TyFloat64, m_func);
                    }
                    else
                    {
                        constOpnd = IR::IntConstOpnd::New(0, TyInt32, this->m_func, true);
                    }
                    InsertMove(dst, constOpnd, ldElem);

                    ldElem->FreeSrc1();
                    ldElem->FreeDst();
                    GenerateBailOut(ldElem, nullptr, nullptr);
                    emittedFastPath = true;
                }

                return !emittedFastPath;
            }
            // The global optimizer should never type specialize a LdElem for which the index is not int or an integer constant
            // with a negative value. This would force an unconditional bail out on the main code path.
            else if (dst->IsVar())
            {
                if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->m_func) && PHASE_TRACE(Js::LowererPhase, this->m_func))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    Output::Print(_u("Typed Array Lowering: function: %s (%s): instr %s, not specialized by glob opt due to negative or not likely int index.\n"),
                        this->m_func->GetJITFunctionBody()->GetDisplayName(),
                        this->m_func->GetDebugNumberSet(debugStringBuffer),
                        Js::OpCodeUtil::GetOpCodeName(ldElem->m_opcode));
                    Output::Flush();
                }

                // We must be dealing with some unconventional index value.  Don't emit fast path, but go directly to helper.
                emittedFastPath = false;
                return true;
            }
            else
            {
                AssertMsg(false, "Global optimizer shouldn't have specialized this instruction.");
                Assert(dst->IsRegOpnd());

                // If global optimizer failed to notice the unconventional index and type specialized the dst,
                // there is nothing to do but bail out. This could happen if global optimizer's information based
                // on value tracking fails to recognize a non-integer index or a constant int index that is negative.
                // The bailout below ensures that we behave correctly in retail builds even under
                // these (unlikely) conditions. To satisfy the downstream code we must populate the type specialized operand
                // with some made up values, even though we will unconditionally bail out here and the values will never be
                // used.
                IR::IntConstOpnd *constOpnd = IR::IntConstOpnd::New(0, TyInt32, this->m_func, true);
                InsertMove(dst, constOpnd, ldElem);

                ldElem->FreeSrc1();
                ldElem->FreeDst();
                GenerateBailOut(ldElem, nullptr, nullptr);
                return false;
            }
        }

        const IR::AutoReuseOpnd autoReuseIndirOpnd(indirOpnd, m_func);
        const ValueType baseValueType(src1->AsIndirOpnd()->GetBaseOpnd()->GetValueType());

        if ((ldElem->HasBailOutInfo() &&
                ldElem->GetByteCodeOffset() != Js::Constants::NoByteCodeOffset &&
                ldElem->GetBailOutInfo()->bailOutOffset <= ldElem->GetByteCodeOffset() &&
                dst->IsEqual(src1->AsIndirOpnd()->GetBaseOpnd())) ||
            (src1->AsIndirOpnd()->GetIndexOpnd() && dst->IsEqual(src1->AsIndirOpnd()->GetIndexOpnd())))
        {
            // This is a pre-op bailout where the dst is the same as one of the srcs. The dst may be trashed before bailing out,
            // but since the operation will be processed again in the interpreter, src values need to be kept intact. Use a
            // temporary dst until after the operation is complete.
            IR::Instr *instrSink = ldElem->SinkDst(Js::OpCode::Ld_A);

            // The sink instruction needs to be on the fall-through path
            instrSink->Unlink();
            labelFallThru->InsertAfter(instrSink);

            LowererMD::ChangeToAssign(instrSink);
            dst = ldElem->GetDst();
        }

        if (isTypedArrayElement)
        {
            // For typedArrays, convert the loaded element to the appropriate type
            IR::RegOpnd *reg;
            IR::AutoReuseOpnd autoReuseReg;

            Assert(dst->IsRegOpnd());

            if(indirOpnd->IsFloat())
            {
                AssertMsg((dstType == TyFloat64) || (dstType == TyVar), "For Float32Array LdElemI's dst should be specialized to TyFloat64 or not at all.");

                if(indirOpnd->IsFloat32())
                {
                    // MOVSS reg32.f32, indirOpnd.f32
                    IR::RegOpnd *reg32 = IR::RegOpnd::New(TyFloat32, this->m_func);
                    const IR::AutoReuseOpnd autoReuseReg32(reg32, m_func);
                    InsertMove(reg32, indirOpnd, ldElem);

                    // CVTPS2PD dst/reg.f64, reg32.f64
                    reg = dstType == TyFloat64 ? dst->AsRegOpnd() : IR::RegOpnd::New(TyFloat64, this->m_func);
                    autoReuseReg.Initialize(reg, m_func);
                    InsertConvertFloat32ToFloat64(reg, reg32, ldElem);
                }
                else
                {
                    Assert(indirOpnd->IsFloat64());

                    // MOVSD dst/reg.f64, indirOpnd.f64
                    reg = dstType == TyFloat64 ? dst->AsRegOpnd() : IR::RegOpnd::New(TyFloat64, this->m_func);
                    autoReuseReg.Initialize(reg, m_func);
                    InsertMove(reg, indirOpnd, ldElem);
                }

                if (dstType != TyFloat64)
                {
                    // Convert reg.f64 to var
                    m_lowererMD.SaveDoubleToVar(dst->AsRegOpnd(), reg, ldElem, ldElem);
                }

#if FLOATVAR
                // For NaNs, go to the helper to guarantee we don't have an illegal NaN
                // TODO(magardn): move this to MD code.
#if _M_X64
                // UCOMISD reg, reg
                {
                    IR::Instr *const instr = IR::Instr::New(Js::OpCode::UCOMISD, this->m_func);
                    instr->SetSrc1(reg);
                    instr->SetSrc2(reg);
                    ldElem->InsertBefore(instr);
                }

                // JP $helper
                {
                    IR::Instr *const instr = IR::BranchInstr::New(Js::OpCode::JP, labelHelper, this->m_func);
                    ldElem->InsertBefore(instr);
                }
#elif _M_ARM64
                // FCMP reg, reg
                {
                    IR::Instr *const instr = IR::Instr::New(Js::OpCode::FCMP, this->m_func);
                    instr->SetSrc1(reg);
                    instr->SetSrc2(reg);
                    ldElem->InsertBefore(instr);
                }

                // BVS $helper
                {
                    IR::Instr *const instr = IR::BranchInstr::New(Js::OpCode::BVS, labelHelper, this->m_func);
                    ldElem->InsertBefore(instr);
                }
#endif
#endif

                if(dstType == TyFloat64)
                {
                    emitBailout = true;
                }
            }
            else
            {
                AssertMsg((dstType == TyInt32) || (dstType == TyVar), "For Int/UintArray LdElemI's dst should be specialized to TyInt32 or not at all.");

                reg = dstType == TyInt32 ? dst->AsRegOpnd() : IR::RegOpnd::New(TyInt32, this->m_func);
                autoReuseReg.Initialize(reg, m_func);

                // Int32 and Uint32 arrays could overflow an int31, but the others can't
                if (indirOpnd->GetType() != TyUint32
#if !INT32VAR
                    && indirOpnd->GetType() != TyInt32
#endif
                    )
                {
                    reg->SetValueType(ValueType::GetTaggedInt());  // Fits as a tagged-int
                }

                // MOV/MOVZX/MOVSX dst/reg.int32, IndirOpnd.type
                IR::Instr* instrMov = InsertMove(reg, indirOpnd, ldElem);
                if (maskOpnd)
                {
#if TARGET_64
                    if (maskOpnd->GetSize() != reg->GetType())
                    {
                        maskOpnd = maskOpnd->UseWithNewType(reg->GetType(), m_func)->AsRegOpnd();
                    }
#endif
                    instrMov = InsertAnd(reg, reg, maskOpnd, ldElem);
                }

                if (dstType == TyInt32)
                {
                    instrMov->dstIsTempNumber = ldElem->dstIsTempNumber;
                    instrMov->dstIsTempNumberTransferred = ldElem->dstIsTempNumberTransferred;

                    if (indirOpnd->GetType() == TyUint32)
                    {
                        // TEST dst, dst
                        // JSB $helper (bailout)
                        InsertCompareBranch(
                            reg,
                            IR::IntConstOpnd::New(0, TyUint32, this->m_func, /* dontEncode = */ true),
                            Js::OpCode::BrLt_A,
                            labelHelper,
                            ldElem);
                    }

                    emitBailout = true;
                }
                else
                {
                    // MOV dst, reg
                    IR::Instr *const instr = IR::Instr::New(Js::OpCode::ToVar, dst, reg, this->m_func);
                    instr->dstIsTempNumber = ldElem->dstIsTempNumber;
                    instr->dstIsTempNumberTransferred = ldElem->dstIsTempNumberTransferred;
                    ldElem->InsertBefore(instr);

                    // Convert dst to var
                    m_lowererMD.EmitLoadVar(instr, /* isFromUint32 = */ (indirOpnd->GetType() == TyUint32));
                }
            }

            //  JMP $fallthrough
            InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);

            emittedFastPath = true;

            if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->m_func) && PHASE_TRACE(Js::LowererPhase, this->m_func))
            {
                char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                baseValueType.ToString(baseValueTypeStr);
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u("Typed Array Lowering: function: %s (%s), instr: %s, base value type: %S, %s."),
                    this->m_func->GetJITFunctionBody()->GetDisplayName(),
                    this->m_func->GetDebugNumberSet(debugStringBuffer),
                    Js::OpCodeUtil::GetOpCodeName(ldElem->m_opcode),
                    baseValueTypeStr,
                    (!dst->IsVar() ? _u("specialized") : _u("not specialized")));
                Output::Print(_u("\n"));
                Output::Flush();
            }
        }
        else
        {
            // MOV dst, indirOpnd
            InsertMove(dst, indirOpnd, ldElem);
            if (maskOpnd)
            {
#if TARGET_64
                if (maskOpnd->GetSize() != dst->GetType())
                {
                    maskOpnd = maskOpnd->UseWithNewType(dst->GetType(), m_func)->AsRegOpnd();
                }
#endif
                InsertAnd(dst, dst, maskOpnd, ldElem);
            }

            // The string index fast path does not operate on index properties (we don't get a PropertyString in that case), so
            // we don't need to do any further checks in that case

            // For LdMethodElem, if the loaded value is a tagged number, the error message generated by the helper call is
            // better than if we were to just try to call the number. Also, the call arguments need to be evaluated before
            // throwing the error, so just test whether it's an object and jump to helper if it's not.
            const bool needObjectTest = !isStringIndex && !isNativeArrayLoad && ldElem->m_opcode == Js::OpCode::LdMethodElem;
            needMissingValueCheck =
                !isStringIndex && !(baseValueType.IsArrayOrObjectWithArray() && baseValueType.HasNoMissingValues());
            if(needMissingValueCheck)
            {
                //  TEST dst, dst
                //  JEQ $helper | JNE $fallthrough
                InsertMissingItemCompareBranch(
                    dst,
                    needObjectTest ? Js::OpCode::BrEq_A : Js::OpCode::BrNeq_A,
                    needObjectTest ? labelHelper : labelFallThru,
                    ldElem);

                if (isNativeArrayLoad)
                {
                    Assert(!needObjectTest);
                    Assert(labelHelper != labelBailOut);
                    if(ldElem->AsProfiledInstr()->u.ldElemInfo->GetElementType().HasBeenUndefined())
                    {
                        // We're going to bail out trying to load "missing value" into a type-spec'd opnd.
                        // Branch to a point where we'll convert the array so that we don't keep bailing here.
                        // (Gappy arrays are not well-suited to nativeness.)
                        labelMissingNative = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
                        InsertBranch(Js::OpCode::Br, labelMissingNative, ldElem);
                    }
                    else
                    {
                        // If the value has not been profiled to be undefined at some point, jump directly to bail out
                        InsertBranch(Js::OpCode::Br, labelBailOut, ldElem);
                    }
                }
            }
            if(needObjectTest)
            {
                //  GenerateObjectTest(dst)
                //  JIsObject $fallthrough
                m_lowererMD.GenerateObjectTest(dst, ldElem, labelFallThru, true);
            }
            else if(!needMissingValueCheck)
            {
                //  JMP $fallthrough
                InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);
            }

            emittedFastPath = true;
        }
    }
    // $helper:
    //      bailout or caller generated helper call
    // $fallthru:

    if (!emittedFastPath)
    {
        labelHelper->isOpHelper = false;
    }

    ldElem->InsertBefore(labelHelper);
    instrIsInHelperBlock = true;

    if (isNativeArrayLoad)
    {
        Assert(ldElem->HasBailOutInfo());
        Assert(labelHelper != labelBailOut);

        // Transform the original instr:
        //
        // $helper:
        // dst = LdElemI_A src (BailOut)
        // $fallthrough:
        //
        // to:
        //
        // b $fallthru  <--- we get here if we loaded a valid element directly
        // $helper:
        // dst = LdElemI_A src
        // cmp dst, MissingItem
        // bne $fallthrough
        // $bailout:
        //       BailOut
        // $fallthrough:

        LowerOneBailOutKind(ldElem, IR::BailOutConventionalNativeArrayAccessOnly, instrIsInHelperBlock);
        IR::Instr *const insertBeforeInstr = ldElem->m_next;

        // Do missing value check on value returned from helper so that we don't have to check the index against
        // array length. (We already checked it above against the segment length.)

        bool hasBeenUndefined = ldElem->AsProfiledInstr()->u.ldElemInfo->GetElementType().HasBeenUndefined();
        if (hasBeenUndefined)
        {
            if(!emitBailout)
            {
                if (labelMissingNative == nullptr)
                {
                    labelMissingNative = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
#if DBG
                    labelMissingNative->m_noLazyHelperAssert = true;
#endif
                }

                InsertMissingItemCompareBranch(ldElem->GetDst(), Js::OpCode::BrEq_A, labelMissingNative, insertBeforeInstr);
            }
            InsertBranch(Js::OpCode::Br, labelFallThru, insertBeforeInstr);
            if(labelMissingNative)
            {
                // We're going to bail out on a load from a gap, but convert the array to Var first, so we don't just
                // bail here over and over. Gappy arrays are not well suited to nativeness.
                // NOTE: only emit this call if the profile tells us that this has happened before ("hasBeenUndefined").
                // Emitting this in Navier-Stokes brutalizes the score.
                insertBeforeInstr->InsertBefore(labelMissingNative);
                IR::JnHelperMethod helperMethod;
                indirOpnd = ldElem->GetSrc1()->AsIndirOpnd();
                if (indirOpnd->GetBaseOpnd()->GetValueType().HasIntElements())
                {
                    helperMethod = IR::HelperIntArr_ToVarArray;
                }
                else
                {
                    Assert(indirOpnd->GetBaseOpnd()->GetValueType().HasFloatElements());
                    helperMethod = IR::HelperFloatArr_ToVarArray;
                }
                m_lowererMD.LoadHelperArgument(insertBeforeInstr, indirOpnd->GetBaseOpnd());
                IR::Instr *instrHelper = IR::Instr::New(Js::OpCode::Call, m_func);
                instrHelper->SetSrc1(IR::HelperCallOpnd::New(helperMethod, m_func));
                insertBeforeInstr->InsertBefore(instrHelper);
                m_lowererMD.LowerCall(instrHelper, 0);
            }
        }
        else
        {
            if(!emitBailout)
            {
                InsertMissingItemCompareBranch(ldElem->GetDst(), Js::OpCode::BrEq_A, labelBailOut, insertBeforeInstr);
            }

            InsertBranch(Js::OpCode::Br, labelFallThru, insertBeforeInstr);
        }

        insertBeforeInstr->InsertBefore(labelBailOut);
    }

    if (emitBailout)
    {
        ldElem->UnlinkSrc1();
        ldElem->UnlinkDst();
        GenerateBailOut(ldElem, nullptr, nullptr);
    }

    return !emitBailout;
}